

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  ulong uVar1;
  int iVar2;
  const_reference ppLVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  Mat *pMVar7;
  int iVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  bool bVar9;
  int top_blob_index_2;
  size_t i_2;
  int ret_5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int top_blob_index_1;
  size_t i_1;
  int ret_4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs;
  int ret_3;
  int bottom_blob_index_1;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int ret_2;
  Mat top_blob;
  int ret_1;
  Mat *bottom_top_blob;
  Mat bottom_blob;
  int ret;
  int top_blob_index;
  int bottom_blob_index;
  Layer *layer;
  Mat *in_stack_fffffffffffffd90;
  Mat *in_stack_fffffffffffffd98;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  size_type in_stack_fffffffffffffda8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffdb0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_01;
  Mat *local_1e0;
  undefined1 local_1d1 [29];
  int local_1b4;
  ulong local_1b0;
  int local_1a4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a0;
  Mat local_198;
  int local_158;
  int local_154;
  ulong local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_140;
  int local_124;
  Mat local_120;
  uint local_e0;
  int local_dc;
  Mat *local_d8;
  Mat local_d0;
  Mat local_80;
  undefined4 local_3c;
  value_type local_38;
  int local_34;
  value_type opt_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  blob_mats_00 = in_RCX;
  ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                       (long)in_ESI);
  iVar8 = (int)in_RCX;
  opt_00 = *ppLVar3;
  if ((opt_00->one_blob_only & 1U) == 0) {
    std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms);
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x137555);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x13757b);
    for (local_150 = 0; uVar1 = local_150,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms), uVar1 < sVar6;
        local_150 = local_150 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,local_150);
      iVar8 = (int)sVar6;
      local_154 = *pvVar4;
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (in_RDX,(long)local_154);
      if (pvVar5->dims == 0) {
        std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                  ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10),
                   (long)local_154);
        iVar8 = (int)blob_mats_00;
        local_158 = forward_layer((Net *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  (int)((ulong)in_RDX >> 0x20),blob_mats_00,(Option *)opt_00);
        if (local_158 != 0) {
          local_e0 = 1;
          local_4 = local_158;
          goto LAB_00137b14;
        }
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_154);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_140,local_150);
      Mat::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      if (((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start & 1) != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_154);
        Mat::release(in_stack_fffffffffffffd90);
        if (((opt_00->support_inplace & 1U) != 0) &&
           (pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (&local_140,local_150), *pvVar5->refcount != 1)) {
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (&local_140,local_150);
          Mat::clone(&local_198,(__fn *)pvVar5,(void *)0x0,iVar8,in_R8);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_140,local_150);
          Mat::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
          Mat::~Mat((Mat *)0x1377ab);
        }
      }
    }
    if ((((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start & 1) == 0) ||
       ((opt_00->support_inplace & 1U) == 0)) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->tops);
      this_01 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_1d1;
      std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x13795c);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (this_01,sVar6,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x137982);
      in_stack_fffffffffffffda4 =
           (*opt_00->_vptr_Layer[6])(opt_00,&local_140,local_1d1 + 1,blob_mats_00);
      if (in_stack_fffffffffffffda4 == 0) {
        local_1e0 = (Mat *)0x0;
        while (this_00 = local_1e0,
              pMVar7 = (Mat *)std::vector<int,_std::allocator<int>_>::size(&opt_00->tops),
              this_00 < pMVar7) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&opt_00->tops,(size_type)local_1e0);
          iVar8 = *pvVar4;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_1d1 + 1),
                              (size_type)local_1e0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)iVar8);
          Mat::operator=(this_00,pvVar5);
          local_1e0 = (Mat *)((long)&local_1e0->data + 1);
        }
        local_e0 = 0;
      }
      else {
        local_e0 = 1;
        local_4 = in_stack_fffffffffffffda4;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      if (local_e0 == 0) goto LAB_00137b09;
    }
    else {
      local_1a0 = &local_140;
      local_1a4 = (*opt_00->_vptr_Layer[8])(opt_00,local_1a0,blob_mats_00);
      if (local_1a4 == 0) {
        for (local_1b0 = 0; uVar1 = local_1b0,
            sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->tops), uVar1 < sVar6;
            local_1b0 = local_1b0 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->tops,local_1b0);
          local_1b4 = *pvVar4;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a0,local_1b0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_1b4);
          Mat::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        }
LAB_00137b09:
        local_e0 = 0;
      }
      else {
        local_e0 = 1;
        local_4 = local_1a4;
      }
    }
LAB_00137b14:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    goto joined_r0x00137b2a;
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,0);
  local_34 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->tops,0);
  local_38 = *pvVar4;
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
  if (pvVar5->dims == 0) {
    std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10),(long)local_34);
    iVar8 = (int)blob_mats_00;
    iVar2 = forward_layer((Net *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDX >> 0x20),blob_mats_00,(Option *)opt_00);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_3c = 0;
  }
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
  Mat::Mat(&local_80,pvVar5);
  if (((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start & 1) != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
    Mat::release(in_stack_fffffffffffffd90);
    if (((opt_00->support_inplace & 1U) != 0) && (*local_80.refcount != 1)) {
      Mat::clone(&local_d0,(__fn *)&local_80,(void *)0x0,iVar8,in_R8);
      Mat::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      Mat::~Mat((Mat *)0x137301);
    }
  }
  if ((((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start & 1) == 0) || ((opt_00->support_inplace & 1U) == 0))
  {
    Mat::Mat(&local_120);
    local_124 = (*opt_00->_vptr_Layer[7])(opt_00,&local_80,&local_120,blob_mats_00);
    bVar9 = local_124 == 0;
    iVar8 = local_124;
    if (bVar9) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_38);
      Mat::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      iVar8 = local_4;
    }
    local_4 = iVar8;
    local_e0 = (uint)!bVar9;
    Mat::~Mat((Mat *)0x1374dd);
    if (local_e0 == 0) goto LAB_001374ec;
  }
  else {
    local_d8 = &local_80;
    local_dc = (*opt_00->_vptr_Layer[9])(opt_00,local_d8,blob_mats_00);
    if (local_dc == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_38);
      Mat::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
LAB_001374ec:
      local_e0 = 0;
    }
    else {
      local_e0 = 1;
      local_4 = local_dc;
    }
  }
  Mat::~Mat((Mat *)0x137504);
joined_r0x00137b2a:
  if (local_e0 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}